

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O1

long __thiscall duckdb::BinaryDeserializer::VarIntDecode<long>(BinaryDeserializer *this)

{
  byte bVar1;
  ulong uVar2;
  idx_t shift;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  uint8_t byte;
  long lVar6;
  bool bVar7;
  uint8_t buffer [16];
  byte local_28 [16];
  
  pbVar4 = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = 0;
  local_28[0xb] = 0;
  local_28[0xc] = 0;
  local_28[0xd] = 0;
  local_28[0xe] = 0;
  local_28[0xf] = 0;
  lVar6 = 0;
  do {
    (**this->stream->_vptr_ReadStream)(this->stream,local_28 + lVar6,1);
    if (-1 < (char)local_28[lVar6]) break;
    bVar7 = lVar6 != 0xf;
    lVar6 = lVar6 + 1;
  } while (bVar7);
  uVar2 = 0;
  uVar3 = 0;
  do {
    bVar1 = *pbVar4;
    uVar2 = uVar2 | (ulong)(bVar1 & 0x7f) << ((byte)uVar3 & 0x3f);
    uVar3 = uVar3 + 7;
    pbVar4 = pbVar4 + 1;
  } while ((char)bVar1 < '\0');
  uVar5 = -1L << ((byte)uVar3 & 0x3f);
  if (bVar1 < 0x40) {
    uVar5 = 0;
  }
  if (0x3f < uVar3) {
    uVar5 = 0;
  }
  return uVar2 | uVar5;
}

Assistant:

T VarIntDecode() {
		// FIXME: maybe we should pass a source to EncodingUtil instead
		uint8_t buffer[16] = {};
		idx_t varint_size;
		for (varint_size = 0; varint_size < 16; varint_size++) {
			ReadData(buffer + varint_size, 1);
			if (!(buffer[varint_size] & 0x80)) {
				varint_size++;
				break;
			}
		}
		T value;
		auto read_size = EncodingUtil::DecodeLEB128<T>(buffer, value);
		D_ASSERT(read_size == varint_size);
		(void)read_size;
		return value;
	}